

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O1

int __thiscall CWire::GetRoutableLength(CWire *this,int iLayer)

{
  short sVar1;
  short sVar2;
  short sVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  CLayer *this_00;
  CBoundary *pCVar8;
  int iY;
  int iY_00;
  
  this_00 = CDesign::GetLayer(CObject::m_pDesign,iLayer);
  uVar4 = (this->super_CObject).m_iProp;
  if ((uVar4 & 5) == 0) {
    if ((uVar4 & 10) == 0) {
      return -1;
    }
    iVar6 = CLayer::IsHorizontal(this_00);
    if (iVar6 != 0) {
      return 0;
    }
    sVar1 = this->m_pPointS->m_iX;
    if (sVar1 != this->m_pPointE->m_iX) {
      __assert_fail("m_pPointS->X()==m_pPointE->X()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                    ,0x5ac,"int CWire::GetRoutableLength(int)");
    }
    sVar2 = this->m_pPointS->m_iY;
    iY_00 = (int)sVar2;
    sVar3 = this->m_pPointE->m_iY;
    iVar6 = (int)sVar3;
    if (sVar3 <= sVar2) {
      __assert_fail("iMinY<iMaxY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                    ,0x5b1,"int CWire::GetRoutableLength(int)");
    }
    pCVar8 = CLayer::GetBoundary(this_00,(int)sVar1,iY_00);
    iVar7 = CBoundary::GetCapacity(pCVar8,0x1000);
    bVar5 = true;
    iY = iY_00;
    if (1 < iVar7) {
      do {
        if (iVar6 + -1 == iY) goto LAB_00121287;
        iY = iY + 1;
        pCVar8 = CLayer::GetBoundary(this_00,(int)sVar1,iY);
        iVar7 = CBoundary::GetCapacity(pCVar8,0x1000);
      } while (1 < iVar7);
LAB_0012127c:
      bVar5 = iY < iVar6;
    }
  }
  else {
    iVar6 = CLayer::IsVertical(this_00);
    if (iVar6 != 0) {
      return 0;
    }
    sVar1 = this->m_pPointS->m_iY;
    if (sVar1 != this->m_pPointE->m_iY) {
      __assert_fail("m_pPointS->Y()==m_pPointE->Y()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                    ,0x59d,"int CWire::GetRoutableLength(int)");
    }
    sVar2 = this->m_pPointS->m_iX;
    iY_00 = (int)sVar2;
    sVar3 = this->m_pPointE->m_iX;
    iVar6 = (int)sVar3;
    if (sVar3 <= sVar2) {
      __assert_fail("iMinX<iMaxX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                    ,0x5a3,"int CWire::GetRoutableLength(int)");
    }
    pCVar8 = CLayer::GetBoundary(this_00,iY_00,(int)sVar1);
    iVar7 = CBoundary::GetCapacity(pCVar8,0x1000);
    bVar5 = true;
    iY = iY_00;
    if (1 < iVar7) {
      do {
        if (iVar6 + -1 == iY) goto LAB_00121287;
        iY = iY + 1;
        pCVar8 = CLayer::GetBoundary(this_00,iY,(int)sVar1);
        iVar7 = CBoundary::GetCapacity(pCVar8,0x1000);
      } while (1 < iVar7);
      goto LAB_0012127c;
    }
  }
  iY = iY - iY_00;
LAB_00121289:
  if (!bVar5) {
    return -1;
  }
  return iY;
LAB_00121287:
  bVar5 = false;
  goto LAB_00121289;
}

Assistant:

int CWire::GetRoutableLength(int iLayer)
{
	CLayer*	pLayer		=	GetDesign()->GetLayer(iLayer);

	if(IsHorizontal())
	{
		if(pLayer->IsVertical())	return	FALSE;

		assert(m_pPointS->Y()==m_pPointE->Y());
		int	iY		=	m_pPointS->Y();
		int iMinX	=	m_pPointS->X();
		int	iMaxX	=	m_pPointE->X();

		// the last point doesn't require to update boundary [6/18/2006 thyeros]
		assert(iMinX<iMaxX);

		for (int i=iMinX;i<iMaxX;++i)	
			if(pLayer->GetBoundary(i,iY)->GetCapacity(GET_MODE_ACAP)<WIRE_WIDTH_SPACE)	return	i-iMinX;
	}
	else if(IsVertical())
	{
		if(pLayer->IsHorizontal())	return	FALSE;

		assert(m_pPointS->X()==m_pPointE->X());
		int	iX		=	m_pPointS->X();
		int iMinY	=	m_pPointS->Y();
		int	iMaxY	=	m_pPointE->Y();

		assert(iMinY<iMaxY);

		for (int i=iMinY;i<iMaxY;++i)
			//	if(pLayer->GetBoundary(iX,i)->GetCongestion()>0.8) 	return	FALSE;

			if(pLayer->GetBoundary(iX,i)->GetCapacity(GET_MODE_ACAP)<WIRE_WIDTH_SPACE)	return	i-iMinY;
	}	

	return	-1;
}